

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::print_preamble
               (char *out_buff,size_t out_buff_size,Verbosity verbosity,char *file,uint line)

{
  int iVar1;
  char *pcVar2;
  double dVar3;
  char local_108 [8];
  char shortened_filename [24];
  long pos;
  char *custom_level_name;
  char local_d8 [2];
  char level_buff [6];
  char thread_name [17];
  double uptime_sec;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  duration<long,_std::ratio<1L,_1000L>_> local_a0;
  rep local_98;
  rep uptime_ms;
  tm time_info;
  time_t sec_since_epoch;
  duration<long,_std::ratio<1L,_1000000000L>_> local_48;
  duration<long,_std::ratio<1L,_1000L>_> local_40;
  rep local_38;
  longlong ms_since_epoch;
  char *pcStack_28;
  uint line_local;
  char *file_local;
  size_t sStack_18;
  Verbosity verbosity_local;
  size_t out_buff_size_local;
  char *out_buff_local;
  
  if ((out_buff_size != 0) && (*out_buff = '\0', (g_preamble & 1) != 0)) {
    ms_since_epoch._4_4_ = line;
    pcStack_28 = file;
    file_local._4_4_ = verbosity;
    sStack_18 = out_buff_size;
    out_buff_size_local = (size_t)out_buff;
    sec_since_epoch = std::chrono::_V2::system_clock::now();
    local_48.__r = (rep)std::chrono::
                        time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                            *)&sec_since_epoch);
    local_40.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_48);
    local_38 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_40);
    time_info.tm_zone = (char *)(local_38 / 1000);
    localtime_r((time_t *)&time_info.tm_zone,(tm *)&uptime_ms);
    uptime_sec = (double)std::chrono::_V2::steady_clock::now();
    local_a8.__r = (rep)std::chrono::operator-
                                  ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&uptime_sec,
                                   (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                    *)&s_start_time);
    local_a0.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_a8);
    local_98 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a0);
    dVar3 = (double)local_98;
    memset(local_d8,0,0x11);
    get_thread_name(local_d8,0x11,true);
    if ((s_strip_file_path & 1) != 0) {
      pcStack_28 = filename(pcStack_28);
    }
    pcVar2 = get_verbosity_name(file_local._4_4_);
    if (pcVar2 == (char *)0x0) {
      snprintf((char *)((long)&custom_level_name + 2),5,"% 4d",(ulong)file_local._4_4_);
    }
    else {
      snprintf((char *)((long)&custom_level_name + 2),5,"%s",pcVar2);
    }
    shortened_filename[0x10] = '\0';
    shortened_filename[0x11] = '\0';
    shortened_filename[0x12] = '\0';
    shortened_filename[0x13] = '\0';
    shortened_filename[0x14] = '\0';
    shortened_filename[0x15] = '\0';
    shortened_filename[0x16] = '\0';
    shortened_filename[0x17] = '\0';
    if (((g_preamble_date & 1) != 0) && (sStack_18 != 0)) {
      iVar1 = snprintf((char *)out_buff_size_local,sStack_18,"%04d-%02d-%02d ",
                       (ulong)(time_info.tm_mday + 0x76c),(ulong)(time_info.tm_hour + 1),
                       (ulong)(uint)time_info.tm_min);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_time & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      iVar1 = snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
                       sStack_18 - shortened_filename._16_8_,"%02d:%02d:%02d.%03lld ",
                       (ulong)(uint)time_info.tm_sec,(ulong)uptime_ms._4_4_,(ulong)(uint)uptime_ms,
                       local_38 % 1000);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_uptime & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      iVar1 = snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
                       sStack_18 - shortened_filename._16_8_,"(%8.3fs) ",dVar3 / 1000.0);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_thread & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      iVar1 = snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
                       sStack_18 - shortened_filename._16_8_,"[%-*s]",0x10,local_d8);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_file & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      snprintf(local_108,0x18,"%s",pcStack_28);
      iVar1 = snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
                       sStack_18 - shortened_filename._16_8_,"%*s:%-5u ",0x17,local_108,
                       (ulong)ms_since_epoch._4_4_);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_verbose & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      iVar1 = snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
                       sStack_18 - shortened_filename._16_8_,"%4s",(long)&custom_level_name + 2);
      shortened_filename._16_8_ = (long)iVar1 + shortened_filename._16_8_;
    }
    if (((g_preamble_pipe & 1) != 0) && ((ulong)shortened_filename._16_8_ < sStack_18)) {
      snprintf((char *)(out_buff_size_local + shortened_filename._16_8_),
               sStack_18 - shortened_filename._16_8_,"| ");
    }
  }
  return;
}

Assistant:

static void print_preamble(char* out_buff, size_t out_buff_size, Verbosity verbosity, const char* file, unsigned line)
	{
		if (out_buff_size == 0) { return; }
		out_buff[0] = '\0';
		if (!g_preamble) { return; }
		long long ms_since_epoch = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count();
		time_t sec_since_epoch = time_t(ms_since_epoch / 1000);
		tm time_info;
		localtime_r(&sec_since_epoch, &time_info);

		auto uptime_ms = duration_cast<milliseconds>(steady_clock::now() - s_start_time).count();
		auto uptime_sec = static_cast<double> (uptime_ms) / 1000.0;

		char thread_name[LOGURU_THREADNAME_WIDTH + 1] = {0};
		get_thread_name(thread_name, LOGURU_THREADNAME_WIDTH + 1, true);

		if (s_strip_file_path) {
			file = filename(file);
		}

		char level_buff[6];
		const char* custom_level_name = get_verbosity_name(verbosity);
		if (custom_level_name) {
			snprintf(level_buff, sizeof(level_buff) - 1, "%s", custom_level_name);
		} else {
			snprintf(level_buff, sizeof(level_buff) - 1, "% 4d", verbosity);
		}

		long pos = 0;

		if (g_preamble_date && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%04d-%02d-%02d ",
				             1900 + time_info.tm_year, 1 + time_info.tm_mon, time_info.tm_mday);
		}
		if (g_preamble_time && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%02d:%02d:%02d.%03lld ",
			               time_info.tm_hour, time_info.tm_min, time_info.tm_sec, ms_since_epoch % 1000);
		}
		if (g_preamble_uptime && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "(%8.3fs) ",
			               uptime_sec);
		}
		if (g_preamble_thread && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "[%-*s]",
			               LOGURU_THREADNAME_WIDTH, thread_name);
		}
		if (g_preamble_file && pos < out_buff_size) {
			char shortened_filename[LOGURU_FILENAME_WIDTH + 1];
			snprintf(shortened_filename, LOGURU_FILENAME_WIDTH + 1, "%s", file);
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%*s:%-5u ",
			               LOGURU_FILENAME_WIDTH, shortened_filename, line);
		}
		if (g_preamble_verbose && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%4s",
			               level_buff);
		}
		if (g_preamble_pipe && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "| ");
		}
	}